

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_remove_mapped_block
               (uc_struct_conflict15 *uc,MemoryRegion_conflict *mr,_Bool free)

{
  ulong local_28;
  size_t i;
  _Bool free_local;
  MemoryRegion_conflict *mr_local;
  uc_struct_conflict15 *uc_local;
  
  local_28 = 0;
  while( true ) {
    if (uc->mapped_block_count <= local_28) {
      return;
    }
    if (uc->mapped_blocks[local_28] == (MemoryRegion *)mr) break;
    local_28 = local_28 + 1;
  }
  uc->mapped_block_count = uc->mapped_block_count - 1;
  memmove(uc->mapped_blocks + local_28,uc->mapped_blocks + local_28 + 1,
          (uc->mapped_block_count - local_28) * 8);
  if (!free) {
    return;
  }
  (*mr->destructor)((MemoryRegion *)mr);
  g_free(mr);
  return;
}

Assistant:

static void memory_region_remove_mapped_block(struct uc_struct *uc, MemoryRegion *mr, bool free)
{
    size_t i;
    for (i = 0; i < uc->mapped_block_count; i++) {
        if (uc->mapped_blocks[i] == mr) {
            uc->mapped_block_count--;
            //shift remainder of array down over deleted pointer
            memmove(&uc->mapped_blocks[i], &uc->mapped_blocks[i + 1], sizeof(MemoryRegion*) * (uc->mapped_block_count - i));
            if (free) {
                mr->destructor(mr);
                g_free(mr);
            }
            break;
        }
    }
}